

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoaderUVW.h
# Opt level: O2

void __thiscall
chrono::ChLoaderUVWatomic::ComputeQ
          (ChLoaderUVWatomic *this,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  ChVectorDynamic<> *this_00;
  element_type *peVar1;
  int iVar2;
  ChVectorDynamic<> mF;
  double detJ;
  void *local_40 [2];
  int local_30 [2];
  
  peVar1 = (this->super_ChLoaderUVW).loadable.
           super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = &(this->super_ChLoaderUVW).super_ChLoader.Q;
  iVar2 = (**(code **)(*(long *)((long)&peVar1->field_0x0 + *(long *)((long)*peVar1 + -0x78)) + 0x18
                      ))((long)&peVar1->field_0x0 + *(long *)((long)*peVar1 + -0x78));
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar2);
  peVar1 = (this->super_ChLoaderUVW).loadable.
           super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_30[0] = (**(code **)(*(long *)((long)&peVar1->field_0x0 + *(long *)((long)*peVar1 + -0x78))
                            + 0x38))((long)&peVar1->field_0x0 + *(long *)((long)*peVar1 + -0x78));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_40,local_30);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_40);
  (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[5])
            (this->Pu,this->Pv,this->Pw,this,local_40,state_x,state_w);
  peVar1 = (this->super_ChLoaderUVW).loadable.
           super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**(code **)((long)*peVar1 + 0x68))
            (this->Pu,this->Pv,this->Pw,peVar1,this_00,local_30,local_40,state_x,state_w);
  Eigen::internal::handmade_aligned_free(local_40[0]);
  return;
}

Assistant:

virtual void ComputeQ(ChVectorDynamic<>* state_x,  ///< if != 0, update state (pos. part) to this, then evaluate Q
                          ChVectorDynamic<>* state_w   ///< if != 0, update state (speed part) to this, then evaluate Q
                          ) override {
        Q.setZero(loadable->LoadableGet_ndof_w());
        ChVectorDynamic<> mF(loadable->Get_field_ncoords());
        mF.setZero();

        // Compute F=F(u,v,w)
        this->ComputeF(Pu, Pv, Pw, mF, state_x, state_w);

        // Compute N(u,v,w)'*F
        double detJ;
        loadable->ComputeNF(Pu, Pv, Pw, Q, detJ, mF, state_x, state_w);
    }